

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidgetPrivate::isAboutToShow(QWidgetPrivate *this)

{
  uint uVar1;
  long lVar2;
  
  while (((uVar1 = *(uint *)&(this->data).field_0x10, (uVar1 >> 10 & 1) == 0 &&
          ((*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 10) & 1) == 0)) &&
         (lVar2 = *(long *)(*(long *)(*(long *)&this->field_0x8 + 8) + 0x10), lVar2 != 0))) {
    this = *(QWidgetPrivate **)(lVar2 + 8);
  }
  return (bool)((byte)(uVar1 >> 10) & 1);
}

Assistant:

bool QWidgetPrivate::isAboutToShow() const
{
    if (data.in_show)
        return true;

    Q_Q(const QWidget);
    if (q->isHidden())
        return false;

    // The widget will be shown if any of its ancestors are about to show.
    QWidget *parent = q->parentWidget();
    return parent ? parent->d_func()->isAboutToShow() : false;
}